

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

uint GGUFMeta::GKV<unsigned_int>::get_kv(gguf_context *ctx,int k)

{
  uint uVar1;
  runtime_error *this;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int in_ESI;
  undefined8 in_RDI;
  gguf_type kt;
  int in_stack_ffffffffffffff9c;
  gguf_context *in_stack_ffffffffffffffa0;
  string local_30 [32];
  int local_10;
  int local_c;
  undefined8 local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_10 = gguf_get_kv_type(in_RDI,(long)in_ESI);
  if (local_10 != 4) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar2 = gguf_get_key(local_8,(long)local_c);
    uVar3 = gguf_type_name(local_10);
    uVar4 = gguf_type_name(4);
    format_abi_cxx11_((char *)local_30,"key %s has wrong type %s but expected type %s",uVar2,uVar3,
                      uVar4);
    std::runtime_error::runtime_error(this,local_30);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = GKV_Base_Type<unsigned_int,_(gguf_type)4,_&gguf_get_val_u32>::getter
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  return uVar1;
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }